

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Performance::anon_unknown_1::OperatorPerformanceCase::iterate
          (OperatorPerformanceCase *this)

{
  TheilSenCalibrator *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  CaseType CVar5;
  float afVar6 [2];
  pointer pvVar7;
  pointer pWVar8;
  TestContext *this_01;
  iterator __position;
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [12];
  State SVar14;
  undefined4 uVar15;
  undefined4 extraout_EAX;
  deUint64 dVar16;
  deUint64 dVar17;
  float afVar18 [2];
  float *pfVar19;
  float *pfVar20;
  float (*pafVar21) [2];
  long *plVar22;
  SampleBuilder *pSVar23;
  undefined8 *puVar24;
  ulong uVar25;
  pointer pSVar26;
  InternalError *pIVar27;
  TestError *this_02;
  vector<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
  *pvVar28;
  size_type *psVar29;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar30;
  pointer pSVar31;
  long *plVar32;
  int i;
  uint uVar33;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  int extraout_EDX_11;
  ulong uVar34;
  ulong uVar35;
  LineParameters *params;
  LineParameters *params_00;
  LineParameters *params_01;
  float *pfVar36;
  IterateResult IVar37;
  pointer pWVar38;
  pointer pWVar39;
  ulong uVar40;
  undefined *__n;
  char *pcVar41;
  LogNumber<long> *pLVar42;
  ios_base *this_03;
  long lVar43;
  long lVar44;
  long lVar45;
  pointer pcVar46;
  int *piVar47;
  int iVar48;
  long lVar49;
  pointer pWVar50;
  _Alloc_hider _Var51;
  bool bVar52;
  float fVar53;
  float fVar54;
  int iVar55;
  float value;
  LineParameters LVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined8 extraout_XMM0_Qb;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar60 [16];
  int iVar62;
  undefined1 auVar61 [16];
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  vector<float,_std::allocator<float>_> perProgramSlopes;
  string progNdxStr;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> leftData;
  ScopedLogSection section;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> leftData_1;
  float *local_860;
  string local_848;
  string local_828;
  undefined1 local_808 [4];
  undefined1 auStack_804 [12];
  float *local_7f8;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  float *local_790;
  string local_788;
  string local_768;
  LogNumber<long> local_748;
  LineParameters local_6d8;
  ulong local_6c8;
  LogNumber<float> local_6c0;
  string local_658;
  float *local_638;
  iterator iStack_630;
  float *local_628;
  LogNumber<float> local_618;
  long local_5b0;
  undefined1 local_5a8 [8];
  undefined1 auStack_5a0 [24];
  string local_588;
  string local_568;
  qpSampleValueTag local_548;
  float local_544;
  deInt64 local_540;
  ios_base local_538 [8];
  ios_base local_530 [272];
  LogNumber<float> local_420;
  string local_3b8;
  string local_398;
  string local_378;
  long *local_358;
  long local_350;
  long local_348;
  long lStack_340;
  long *local_338;
  long local_330;
  long local_328;
  long lStack_320;
  string local_318;
  string local_2f8;
  string local_2d8;
  long *local_2b8 [2];
  long local_2a8 [2];
  string local_298;
  string local_278;
  long *local_258 [2];
  long local_248 [2];
  undefined1 local_238 [8];
  _func_int **pp_Stack_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  string local_218;
  string local_1f8;
  qpSampleValueTag local_1d8;
  float local_1d4;
  deInt64 local_1d0;
  ios_base local_1c0 [272];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  undefined1 auVar59 [16];
  
  this_00 = &this->m_calibrator;
  SVar14 = deqp::gls::TheilSenCalibrator::getState(this_00);
  if (SVar14 == STATE_FINISHED) {
    if (this->m_state - STATE_FIND_HIGH_WORKLOAD < 2) {
      if (this->m_workloadMeasurementNdx < this->m_numMeasurementsPerWorkload) {
        pvVar28 = &this->m_workloadRecords;
        if (this->m_state == STATE_FIND_HIGH_WORKLOAD) {
          pvVar28 = &this->m_workloadRecordsFindHigh;
        }
        pWVar50 = (pvVar28->
                  super__Vector_base<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[this->m_measureProgramNdx].
                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        iVar55 = (this->m_calibrator).m_measureState.numDrawCalls;
        dVar17 = deGetMicroseconds();
        render(this,iVar55);
        dVar16 = deGetMicroseconds();
        local_5a8._0_4_ = (float)(dVar16 - dVar17);
        __position._M_current =
             pWVar50[-1].frameTimes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            pWVar50[-1].frameTimes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)&pWVar50[-1].frameTimes,__position,
                     (float *)local_5a8);
        }
        else {
          *__position._M_current = (float)(dVar16 - dVar17);
          pWVar50[-1].frameTimes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        this->m_workloadMeasurementNdx = this->m_workloadMeasurementNdx + 1;
      }
      else {
        prepareNextRound(this);
      }
      IVar37 = CONTINUE;
    }
    else {
      pSVar26 = (this->m_programs).
                super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      afVar6 = (float  [2])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      lVar45 = (long)(this->m_calibrator).m_measureState.numDrawCalls;
      pSVar31 = (this->m_programs).
                super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((int)((ulong)((long)pSVar31 - (long)pSVar26) >> 4) < 1) {
        local_7f8 = (float *)0x0;
        local_860 = (float *)0x0;
      }
      else {
        lVar44 = 0;
        local_860 = (float *)0x0;
        pfVar36 = (float *)0x0;
        local_7f8 = (float *)0x0;
        local_5b0 = lVar45;
        do {
          pvVar7 = (this->m_workloadRecords).
                   super__Vector_base<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_618.m_name._M_dataplus._M_p = (pointer)0x0;
          local_618.m_name._M_string_length = 0;
          local_618.m_name.field_2._M_allocated_capacity = 0;
          lVar45 = *(long *)&pvVar7[lVar44].
                             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                             ._M_impl.super__Vector_impl_data;
          local_790 = pfVar36;
          local_6c8 = lVar44;
          if (0 < (int)((ulong)((long)pvVar7[lVar44].
                                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - lVar45) >> 5)) {
            lVar49 = 0;
            lVar43 = 0;
            do {
              iVar55 = *(int *)(lVar45 + lVar49);
              local_5a8._4_4_ = WorkloadRecord::getMedianTime((WorkloadRecord *)(lVar45 + lVar49));
              local_5a8._0_4_ = (float)iVar55;
              std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
              emplace_back<tcu::Vector<float,2>>
                        ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)
                         &local_618,(Vector<float,_2> *)local_5a8);
              lVar43 = lVar43 + 1;
              lVar45 = *(long *)&pvVar7[lVar44].
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                                 ._M_impl.super__Vector_impl_data;
              lVar49 = lVar49 + 0x20;
            } while (lVar43 < (int)((ulong)((long)pvVar7[lVar44].
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           lVar45) >> 5));
          }
          auStack_5a0._0_8_ = auStack_5a0._0_8_ & 0xffffffff00000000;
          auStack_5a0._8_8_ = (_Base_ptr)0x0;
          local_588._M_string_length = 0;
          fVar54 = -INFINITY;
          auStack_5a0._16_8_ = auStack_5a0;
          local_588._M_dataplus._M_p = auStack_5a0;
          if (0 < (int)(local_618.m_name._M_string_length - (long)local_618.m_name._M_dataplus._M_p
                       >> 3)) {
            lVar45 = 0;
            do {
              local_238._0_4_ = *(undefined4 *)(local_618.m_name._M_dataplus._M_p + lVar45 * 8);
              std::
              _Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>
              ::_M_insert_unique<float>
                        ((_Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>
                          *)local_5a8,(float *)local_238);
              lVar45 = lVar45 + 1;
            } while (lVar45 < (int)(local_618.m_name._M_string_length -
                                    (long)local_618.m_name._M_dataplus._M_p >> 3));
            fVar54 = -INFINITY;
            if ((undefined1 *)auStack_5a0._16_8_ != auStack_5a0) {
              fVar54 = -INFINITY;
              local_6d8.offset = INFINITY;
              afVar18 = (float  [2])auStack_5a0._16_8_;
              do {
                local_238 = (undefined1  [8])0x0;
                pp_Stack_230 = (_func_int **)0x0;
                local_228._M_allocated_capacity = 0;
                local_748.m_name.field_2._M_allocated_capacity = 0;
                local_748.m_name._M_dataplus._M_p = (pointer)0x0;
                local_748.m_name._M_string_length = 0;
                if (0 < (int)(local_618.m_name._M_string_length -
                              (long)local_618.m_name._M_dataplus._M_p >> 3)) {
                  lVar45 = 0;
                  lVar44 = 0;
                  do {
                    fVar53 = (float)((_Rb_tree_node_base *)((long)afVar18 + 0x20))->_M_color;
                    pLVar42 = (LogNumber<long> *)local_238;
                    if (fVar53 < *(float *)(local_618.m_name._M_dataplus._M_p + lVar45) ||
                        fVar53 == *(float *)(local_618.m_name._M_dataplus._M_p + lVar45)) {
                      pLVar42 = &local_748;
                    }
                    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                    push_back((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                               *)pLVar42,(value_type *)(local_618.m_name._M_dataplus._M_p + lVar45))
                    ;
                    lVar44 = lVar44 + 1;
                    lVar45 = lVar45 + 8;
                  } while (lVar44 < (int)(local_618.m_name._M_string_length -
                                          (long)local_618.m_name._M_dataplus._M_p >> 3));
                }
                iVar55 = numDistinctX((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                       *)&local_748);
                if (2 < iVar55) {
                  iVar62 = numDistinctX((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                         *)local_238);
                  fVar53 = 0.0;
                  auVar13 = auStack_804;
                  auVar11._12_4_ = 0;
                  auVar11._0_12_ = auStack_804;
                  _local_808 = auVar11 << 0x20;
                  if (2 < iVar62) {
                    uVar34 = (long)pp_Stack_230 - (long)local_238 >> 3;
                    if ((int)(uint)uVar34 < 1) {
                      fVar63 = (float)uVar34;
                      fVar65 = 0.0;
                    }
                    else {
                      uVar25 = (ulong)((uint)uVar34 & 0x7fffffff);
                      uVar40 = 0;
                      do {
                        fVar53 = fVar53 + *(float *)((long)local_238 + uVar40 * 8 + 4);
                        uVar40 = uVar40 + 1;
                      } while (uVar25 != uVar40);
                      fVar63 = (float)uVar34;
                      fVar65 = 0.0;
                      uVar34 = 0;
                      do {
                        fVar64 = fVar53 / fVar63 - *(float *)((long)local_238 + uVar34 * 8 + 4);
                        fVar65 = fVar65 + fVar64 * fVar64;
                        uVar34 = uVar34 + 1;
                      } while (uVar25 != uVar34);
                    }
                    local_808 = (undefined1  [4])(fVar65 / fVar63);
                    _local_808 = CONCAT124(auVar13,local_808);
                  }
                  iVar62 = numDistinctX((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                         *)&local_748);
                  fVar53 = 0.0;
                  if (2 < iVar62) {
                    uVar34 = (long)(local_748.m_name._M_string_length -
                                   (long)local_748.m_name._M_dataplus._M_p) >> 3;
                    if ((int)(uint)uVar34 < 1) {
                      if ((long)uVar34 < 0) {
                        fVar63 = (float)uVar34;
                      }
                      else {
                        fVar63 = (float)(long)uVar34;
                      }
                    }
                    else {
                      uVar25 = (ulong)((uint)uVar34 & 0x7fffffff);
                      uVar40 = 0;
                      auVar58 = ZEXT816(0);
                      do {
                        auVar57._0_4_ =
                             auVar58._0_4_ +
                             (float)*(undefined8 *)(local_748.m_name._M_dataplus._M_p + uVar40 * 8);
                        auVar57._4_4_ =
                             auVar58._4_4_ +
                             (float)((ulong)*(undefined8 *)
                                             (local_748.m_name._M_dataplus._M_p + uVar40 * 8) >>
                                    0x20);
                        auVar57._8_4_ = auVar58._8_4_ + 0.0;
                        auVar57._12_4_ = auVar58._12_4_ + 0.0;
                        uVar40 = uVar40 + 1;
                        auVar58 = auVar57;
                      } while (uVar25 != uVar40);
                      fVar63 = (float)uVar34;
                      auVar9._4_4_ = fVar63;
                      auVar9._0_4_ = fVar63;
                      auVar9._8_4_ = fVar63;
                      auVar9._12_4_ = fVar63;
                      auVar58 = divps(auVar57,auVar9);
                      fVar65 = 0.0;
                      fVar64 = 0.0;
                      uVar34 = 0;
                      do {
                        fVar53 = (float)*(undefined8 *)
                                         (local_748.m_name._M_dataplus._M_p + uVar34 * 8) -
                                 auVar58._0_4_;
                        fVar65 = fVar65 + fVar53 * fVar53;
                        fVar64 = fVar64 + fVar53 * ((float)((ulong)*(undefined8 *)
                                                                    (local_748.m_name._M_dataplus.
                                                                     _M_p + uVar34 * 8) >> 0x20) -
                                                   auVar58._4_4_);
                        uVar34 = uVar34 + 1;
                      } while (uVar25 != uVar34);
                      fVar53 = 0.0;
                      uVar34 = 0;
                      do {
                        fVar66 = (*(float *)(local_748.m_name._M_dataplus._M_p + uVar34 * 8) *
                                  (fVar64 / fVar65) +
                                 (auVar58._4_4_ - (fVar64 / fVar65) * auVar58._0_4_)) -
                                 *(float *)(local_748.m_name._M_dataplus._M_p + uVar34 * 8 + 4);
                        fVar53 = fVar53 + fVar66 * fVar66;
                        uVar34 = uVar34 + 1;
                      } while (uVar25 != uVar34);
                    }
                    fVar53 = fVar53 / fVar63;
                  }
                  if ((float)local_808 + fVar53 < local_6d8.offset) {
                    fVar54 = (float)((_Rb_tree_node_base *)((long)afVar18 + 0x20))->_M_color;
                    local_6d8.offset = (float)local_808 + fVar53;
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_748.m_name._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_748.m_name._M_dataplus._M_p,
                                  local_748.m_name.field_2._M_allocated_capacity -
                                  (long)local_748.m_name._M_dataplus._M_p);
                }
                if (local_238 != (undefined1  [8])0x0) {
                  operator_delete((void *)local_238,
                                  local_228._M_allocated_capacity - (long)local_238);
                }
              } while ((2 < iVar55) &&
                      (afVar18 = (float  [2])std::_Rb_tree_increment((_Rb_tree_node_base *)afVar18),
                      afVar18 != (float  [2])auStack_5a0));
            }
          }
          std::
          _Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>::
          ~_Rb_tree((_Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>
                     *)local_5a8);
          auStack_5a0._8_8_ = (qpTestLog *)0x0;
          local_5a8._0_4_ = 0.0;
          local_5a8._4_4_ = 0.0;
          auStack_5a0._0_4_ = 0.0;
          auStack_5a0._4_4_ = 0.0;
          local_228._M_allocated_capacity = 0;
          local_238 = (undefined1  [8])0x0;
          pp_Stack_230 = (_func_int **)0x0;
          if (0 < (int)(local_618.m_name._M_string_length - (long)local_618.m_name._M_dataplus._M_p
                       >> 3)) {
            lVar45 = 0;
            lVar44 = 0;
            do {
              pLVar42 = (LogNumber<long> *)local_5a8;
              if (fVar54 < *(float *)(local_618.m_name._M_dataplus._M_p + lVar45) ||
                  fVar54 == *(float *)(local_618.m_name._M_dataplus._M_p + lVar45)) {
                pLVar42 = (LogNumber<long> *)local_238;
              }
              std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
                        ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         pLVar42,(value_type *)(local_618.m_name._M_dataplus._M_p + lVar45));
              lVar44 = lVar44 + 1;
              lVar45 = lVar45 + 8;
            } while (lVar44 < (int)(local_618.m_name._M_string_length -
                                    (long)local_618.m_name._M_dataplus._M_p >> 3));
          }
          LVar56 = deqp::gls::theilSenLinearRegression
                             ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                               *)local_5a8);
          auStack_804._4_8_ = extraout_XMM0_Qb;
          local_808 = (undefined1  [4])LVar56.offset;
          auStack_804._0_4_ = LVar56.coefficient;
          local_6d8 = deqp::gls::theilSenLinearRegression
                                ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                  *)local_238);
          pfVar36 = local_790;
          iVar55 = numDistinctX((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                 *)local_5a8);
          uVar34 = local_6c8;
          if (iVar55 < 2) {
LAB_0136e710:
            auVar60._0_8_ =
                 deqp::gls::theilSenLinearRegression
                           ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             *)&local_618);
            auVar60._8_4_ = auVar60._4_4_;
            auVar60._12_4_ = extraout_XMM0_Dd;
            auVar59._8_8_ = auVar60._8_8_;
            auVar59._0_8_ = (ulong)auVar60._0_8_ & 0xffffffff;
            _local_808 = auVar59._0_12_;
            register0x0000120c = 0;
            fVar54 = -INFINITY;
            local_6d8 = auVar60._0_8_;
          }
          else if (local_6d8.coefficient * 0.5 < (float)auStack_804._0_4_) goto LAB_0136e710;
          if (local_238 != (undefined1  [8])0x0) {
            operator_delete((void *)local_238,local_228._M_allocated_capacity - (long)local_238);
          }
          if ((float  [2])local_5a8 != (float  [2])0x0) {
            operator_delete((void *)local_5a8,auStack_5a0._8_8_ - (long)local_5a8);
          }
          if (pfVar36 == local_7f8) {
            uVar34 = (long)pfVar36 - (long)local_860;
            if (uVar34 == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            lVar45 = (long)uVar34 >> 2;
            uVar40 = lVar45 * -0x3333333333333333;
            uVar25 = uVar40;
            if (pfVar36 == local_860) {
              uVar25 = 1;
            }
            uVar35 = uVar25 + uVar40;
            if (0x666666666666665 < uVar35) {
              uVar35 = 0x666666666666666;
            }
            if (CARRY8(uVar25,uVar40)) {
              uVar35 = 0x666666666666666;
            }
            if (uVar35 == 0) {
              pfVar19 = (float *)0x0;
            }
            else {
              pfVar19 = (float *)operator_new(uVar35 * 0x14);
            }
            pfVar19[lVar45] = fVar54;
            *(double *)(pfVar19 + lVar45 + 1) = _local_808;
            *(LineParameters *)(pfVar19 + lVar45 + 1 + 2) = local_6d8;
            pfVar36 = pfVar19;
            for (pfVar20 = local_860; local_790 != pfVar20; pfVar20 = pfVar20 + 5) {
              pfVar36[4] = pfVar20[4];
              uVar10 = *(undefined8 *)(pfVar20 + 2);
              *(undefined8 *)pfVar36 = *(undefined8 *)pfVar20;
              *(undefined8 *)(pfVar36 + 2) = uVar10;
              pfVar36 = pfVar36 + 5;
            }
            if (local_860 != (float *)0x0) {
              operator_delete(local_860,uVar34);
            }
            local_7f8 = pfVar19 + uVar35 * 5;
            uVar34 = local_6c8;
            local_860 = pfVar19;
          }
          else {
            *pfVar36 = fVar54;
            *(double *)(pfVar36 + 1) = _local_808;
            *(LineParameters *)(pfVar36 + 3) = local_6d8;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_618.m_name._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_618.m_name._M_dataplus._M_p,
                            local_618.m_name.field_2._M_allocated_capacity -
                            (long)local_618.m_name._M_dataplus._M_p);
          }
          pfVar36 = pfVar36 + 5;
          lVar44 = uVar34 + 1;
          pSVar26 = (this->m_programs).
                    super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar31 = (this->m_programs).
                    super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          iVar55 = (int)((ulong)((long)pSVar31 - (long)pSVar26) >> 4);
        } while (lVar44 < iVar55);
        lVar45 = local_5b0;
        if (0 < iVar55) {
          auVar12._8_8_ = 0;
          auVar12._0_8_ = auStack_804._4_8_;
          _local_808 = auVar12 << 0x40;
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a8);
            std::ostream::operator<<((MessageBuilder *)local_5a8,local_808);
            std::__cxx11::stringbuf::str();
            __n = &std::__cxx11::ostringstream::VTT;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a8);
            std::ios_base::~ios_base(local_538);
            pvVar7 = (this->m_workloadRecords).
                     super__Vector_base<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar45 = (long)_local_808;
            lVar44 = (long)pvVar7[(long)_local_808].
                           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     *(long *)&pvVar7[(long)_local_808].
                               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                               ._M_impl.super__Vector_impl_data;
            local_658._M_dataplus._M_p =
                 (pointer)std::
                          _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                          ::_M_allocate((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                                         *)(lVar44 >> 5),(size_t)__n);
            local_658.field_2._M_allocated_capacity = lVar44 + (long)local_658._M_dataplus._M_p;
            pWVar50 = pvVar7[lVar45].
                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pWVar8 = pvVar7[lVar45].
                     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            local_658._M_string_length = (size_type)(pointer)local_658._M_dataplus._M_p;
            if (pWVar50 != pWVar8) {
              lVar45 = -(long)local_658._M_dataplus._M_p;
              pWVar39 = (pointer)local_658._M_dataplus._M_p;
              local_658._M_string_length = (size_type)local_658._M_dataplus._M_p;
              do {
                pWVar38 = pWVar39;
                pWVar38->workloadSize = pWVar50->workloadSize;
                std::vector<float,_std::allocator<float>_>::vector
                          (&pWVar38->frameTimes,&pWVar50->frameTimes);
                _Var51._M_p = local_658._M_dataplus._M_p;
                pWVar39 = pWVar38 + 1;
                lVar45 = lVar45 + -0x20;
                pWVar50 = pWVar50 + 1;
              } while (pWVar50 != pWVar8);
              local_658._M_string_length = (size_type)pWVar39;
              if (pWVar39 != (pointer)local_658._M_dataplus._M_p) {
                pcVar46 = local_658._M_dataplus._M_p + lVar45;
                uVar34 = -(long)pcVar46 >> 5;
                lVar45 = 0x3f;
                if (uVar34 != 0) {
                  for (; uVar34 >> lVar45 == 0; lVar45 = lVar45 + -1) {
                  }
                }
                std::
                __introsort_loop<__gnu_cxx::__normal_iterator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord*,std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                          (local_658._M_dataplus._M_p,pWVar39,((uint)lVar45 ^ 0x3f) * 2 ^ 0x7e);
                if (-(long)pcVar46 < 0x201) {
                  std::
                  __insertion_sort<__gnu_cxx::__normal_iterator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord*,std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>>>,__gnu_cxx::__ops::_Iter_less_iter>
                            (_Var51._M_p,pWVar39);
                }
                else {
                  std::
                  __insertion_sort<__gnu_cxx::__normal_iterator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord*,std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>>>,__gnu_cxx::__ops::_Iter_less_iter>
                            (_Var51._M_p,(pointer)(_Var51._M_p + 0x200));
                  if (pWVar39 != (pointer)(_Var51._M_p + 0x200)) {
                    pWVar50 = (pointer)(_Var51._M_p + 0x1e0);
                    do {
                      pWVar50 = pWVar50 + 1;
                      std::
                      __unguarded_linear_insert<__gnu_cxx::__normal_iterator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord*,std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>>>,__gnu_cxx::__ops::_Val_less_iter>
                                (pWVar50);
                    } while (pWVar50 != pWVar38);
                  }
                }
              }
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_238,"Program",&local_618.m_name);
            pafVar21 = (float (*) [2])std::__cxx11::string::append((char *)local_238);
            local_5a8 = (undefined1  [8])((long)auStack_5a0 + 8);
            afVar18 = (float  [2])(pafVar21 + 2);
            if (*pafVar21 == afVar18) {
              auStack_5a0._8_8_ = *(undefined8 *)afVar18;
              auStack_5a0._16_8_ = pafVar21[3];
            }
            else {
              auStack_5a0._8_8_ = *(undefined8 *)afVar18;
              local_5a8 = (undefined1  [8])*pafVar21;
            }
            auStack_5a0._0_8_ = pafVar21[1];
            *pafVar21 = afVar18;
            pafVar21[1] = (float  [2])0x0;
            *(undefined1 *)pafVar21[2] = 0;
            std::operator+(&local_748.m_name,"Measurements for program ",&local_618.m_name);
            tcu::ScopedLogSection::ScopedLogSection
                      ((ScopedLogSection *)&local_3b8,(TestLog *)afVar6,(string *)local_5a8,
                       &local_748.m_name);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_748.m_name._M_dataplus._M_p != &local_748.m_name.field_2) {
              operator_delete(local_748.m_name._M_dataplus._M_p,
                              local_748.m_name.field_2._M_allocated_capacity + 1);
            }
            if (local_5a8 != (undefined1  [8])((long)auStack_5a0 + 8)) {
              operator_delete((void *)local_5a8,(ulong)(auStack_5a0._8_8_ + 1));
            }
            if (local_238 != (undefined1  [8])&local_228) {
              operator_delete((void *)local_238,(ulong)(local_228._M_allocated_capacity + 1));
            }
            std::operator+(&local_420.m_name,"Program",&local_618.m_name);
            plVar22 = (long *)std::__cxx11::string::append((char *)&local_420);
            local_6c0.m_name._M_dataplus._M_p = (pointer)&local_6c0.m_name.field_2;
            psVar29 = (size_type *)(plVar22 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar22 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar29) {
              local_6c0.m_name.field_2._M_allocated_capacity = *psVar29;
              local_6c0.m_name.field_2._8_8_ = plVar22[3];
            }
            else {
              local_6c0.m_name.field_2._M_allocated_capacity = *psVar29;
              local_6c0.m_name._M_dataplus._M_p = (pointer)*plVar22;
            }
            local_6c0.m_name._M_string_length = plVar22[1];
            *plVar22 = (long)psVar29;
            plVar22[1] = 0;
            *(undefined1 *)(plVar22 + 2) = 0;
            local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_828,"Individual frame times","");
            tcu::LogSampleList::LogSampleList
                      ((LogSampleList *)&local_748,&local_6c0.m_name,&local_828);
            tcu::TestLog::startSampleList((TestLog *)afVar6,&local_748.m_name,&local_748.m_desc);
            tcu::TestLog::startSampleInfo((TestLog *)afVar6);
            local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_848,"Workload","");
            local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"Workload","");
            local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_788,0x1af8059);
            tcu::LogValueInfo::LogValueInfo
                      ((LogValueInfo *)local_5a8,&local_848,&local_7f0,&local_788,
                       QP_SAMPLE_VALUE_TAG_PREDICTOR);
            tcu::TestLog::writeValueInfo
                      ((TestLog *)afVar6,(string *)local_5a8,&local_588,&local_568,local_548);
            local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"FrameTime","");
            local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d0,"Frame time","");
            local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"us","");
            tcu::LogValueInfo::LogValueInfo
                      ((LogValueInfo *)local_238,&local_7b0,&local_7d0,&local_768,
                       QP_SAMPLE_VALUE_TAG_RESPONSE);
            tcu::TestLog::writeValueInfo
                      ((TestLog *)afVar6,(string *)local_238,&local_218,&local_1f8,local_1d8);
            tcu::TestLog::endSampleInfo((TestLog *)afVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p != &local_218.field_2) {
              operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_238 != (undefined1  [8])&local_228) {
              operator_delete((void *)local_238,(ulong)(local_228._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_768._M_dataplus._M_p != &local_768.field_2) {
              operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
              operator_delete(local_7d0._M_dataplus._M_p,local_7d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
              operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_568._M_dataplus._M_p != &local_568.field_2) {
              operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_588._M_dataplus._M_p != &local_588.field_2) {
              operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_5a8 != (undefined1  [8])((long)auStack_5a0 + 8)) {
              operator_delete((void *)local_5a8,(ulong)(auStack_5a0._8_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_788._M_dataplus._M_p != &local_788.field_2) {
              operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
              operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_848._M_dataplus._M_p != &local_848.field_2) {
              operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_748.m_desc._M_dataplus._M_p != &local_748.m_desc.field_2) {
              operator_delete(local_748.m_desc._M_dataplus._M_p,
                              local_748.m_desc.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_748.m_name._M_dataplus._M_p != &local_748.m_name.field_2) {
              operator_delete(local_748.m_name._M_dataplus._M_p,
                              local_748.m_name.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_828._M_dataplus._M_p != &local_828.field_2) {
              operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6c0.m_name._M_dataplus._M_p != &local_6c0.m_name.field_2) {
              operator_delete(local_6c0.m_name._M_dataplus._M_p,
                              local_6c0.m_name.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420.m_name._M_dataplus._M_p != &local_420.m_name.field_2) {
              operator_delete(local_420.m_name._M_dataplus._M_p,
                              local_420.m_name.field_2._M_allocated_capacity + 1);
            }
            _Var51._M_p = local_658._M_dataplus._M_p;
            uVar33 = (uint)(local_658._M_string_length - (long)local_658._M_dataplus._M_p >> 5);
            if (0 < (int)uVar33) {
              uVar34 = 0;
              do {
                lVar45 = uVar34 * 0x20;
                if (0 < (int)((ulong)(*(long *)(_Var51._M_p + lVar45 + 0x10) -
                                     *(long *)(_Var51._M_p + lVar45 + 8)) >> 2)) {
                  piVar47 = (int *)(_Var51._M_p + lVar45);
                  lVar45 = 0;
                  do {
                    auStack_5a0._0_4_ = 0.0;
                    auStack_5a0._4_4_ = 0.0;
                    auStack_5a0._8_8_ = (qpTestLog *)0x0;
                    auStack_5a0._16_4_ = 0.0;
                    auStack_5a0._20_4_ = 0.0;
                    local_5a8 = (undefined1  [8])afVar6;
                    pSVar23 = tcu::SampleBuilder::operator<<((SampleBuilder *)local_5a8,*piVar47);
                    pSVar23 = tcu::SampleBuilder::operator<<
                                        (pSVar23,*(float *)(*(long *)(piVar47 + 2) + lVar45 * 4));
                    tcu::SampleBuilder::operator<<
                              (pSVar23,(EndSampleToken *)&tcu::TestLog::EndSample);
                    if ((float  [2])auStack_5a0._0_8_ != (float  [2])0x0) {
                      operator_delete((void *)auStack_5a0._0_8_,
                                      auStack_5a0._16_8_ - auStack_5a0._0_8_);
                    }
                    lVar45 = lVar45 + 1;
                  } while (lVar45 < (int)((ulong)(*(long *)(piVar47 + 4) - *(long *)(piVar47 + 2))
                                         >> 2));
                }
                uVar34 = uVar34 + 1;
              } while (uVar34 != (uVar33 & 0x7fffffff));
            }
            tcu::TestLog::endSampleList((TestLog *)afVar6);
            std::operator+(&local_420.m_name,"Program",&local_618.m_name);
            plVar22 = (long *)std::__cxx11::string::append((char *)&local_420);
            local_6c0.m_name._M_dataplus._M_p = (pointer)&local_6c0.m_name.field_2;
            psVar29 = (size_type *)(plVar22 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar22 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar29) {
              local_6c0.m_name.field_2._M_allocated_capacity = *psVar29;
              local_6c0.m_name.field_2._8_8_ = plVar22[3];
            }
            else {
              local_6c0.m_name.field_2._M_allocated_capacity = *psVar29;
              local_6c0.m_name._M_dataplus._M_p = (pointer)*plVar22;
            }
            local_6c0.m_name._M_string_length = plVar22[1];
            *plVar22 = (long)psVar29;
            plVar22[1] = 0;
            *(undefined1 *)(plVar22 + 2) = 0;
            local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_828,"Median frame times","");
            tcu::LogSampleList::LogSampleList
                      ((LogSampleList *)&local_748,&local_6c0.m_name,&local_828);
            tcu::TestLog::startSampleList((TestLog *)afVar6,&local_748.m_name,&local_748.m_desc);
            tcu::TestLog::startSampleInfo((TestLog *)afVar6);
            local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_848,"Workload","");
            local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"Workload","");
            local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_788,0x1af8059);
            tcu::LogValueInfo::LogValueInfo
                      ((LogValueInfo *)local_5a8,&local_848,&local_7f0,&local_788,
                       QP_SAMPLE_VALUE_TAG_PREDICTOR);
            tcu::TestLog::writeValueInfo
                      ((TestLog *)afVar6,(string *)local_5a8,&local_588,&local_568,local_548);
            local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_7b0,"MedianFrameTime","");
            local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_7d0,"Median frame time","");
            local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"us","");
            tcu::LogValueInfo::LogValueInfo
                      ((LogValueInfo *)local_238,&local_7b0,&local_7d0,&local_768,
                       QP_SAMPLE_VALUE_TAG_RESPONSE);
            tcu::TestLog::writeValueInfo
                      ((TestLog *)afVar6,(string *)local_238,&local_218,&local_1f8,local_1d8);
            tcu::TestLog::endSampleInfo((TestLog *)afVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p != &local_218.field_2) {
              operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_238 != (undefined1  [8])&local_228) {
              operator_delete((void *)local_238,(ulong)(local_228._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_768._M_dataplus._M_p != &local_768.field_2) {
              operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
              operator_delete(local_7d0._M_dataplus._M_p,local_7d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
              operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_568._M_dataplus._M_p != &local_568.field_2) {
              operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_588._M_dataplus._M_p != &local_588.field_2) {
              operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_5a8 != (undefined1  [8])((long)auStack_5a0 + 8)) {
              operator_delete((void *)local_5a8,(ulong)(auStack_5a0._8_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_788._M_dataplus._M_p != &local_788.field_2) {
              operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
              operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_848._M_dataplus._M_p != &local_848.field_2) {
              operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_748.m_desc._M_dataplus._M_p != &local_748.m_desc.field_2) {
              operator_delete(local_748.m_desc._M_dataplus._M_p,
                              local_748.m_desc.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_748.m_name._M_dataplus._M_p != &local_748.m_name.field_2) {
              operator_delete(local_748.m_name._M_dataplus._M_p,
                              local_748.m_name.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_828._M_dataplus._M_p != &local_828.field_2) {
              operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6c0.m_name._M_dataplus._M_p != &local_6c0.m_name.field_2) {
              operator_delete(local_6c0.m_name._M_dataplus._M_p,
                              local_6c0.m_name.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420.m_name._M_dataplus._M_p != &local_420.m_name.field_2) {
              operator_delete(local_420.m_name._M_dataplus._M_p,
                              local_420.m_name.field_2._M_allocated_capacity + 1);
            }
            if (0 < (int)uVar33) {
              uVar34 = (ulong)(uVar33 & 0x7fffffff);
              do {
                auStack_5a0._0_4_ = 0.0;
                auStack_5a0._4_4_ = 0.0;
                auStack_5a0._8_8_ = (qpTestLog *)0x0;
                auStack_5a0._16_4_ = 0.0;
                auStack_5a0._20_4_ = 0.0;
                local_5a8 = (undefined1  [8])afVar6;
                pSVar23 = tcu::SampleBuilder::operator<<
                                    ((SampleBuilder *)local_5a8,
                                     ((WorkloadRecord *)_Var51._M_p)->workloadSize);
                fVar54 = WorkloadRecord::getMedianTime((WorkloadRecord *)_Var51._M_p);
                pSVar23 = tcu::SampleBuilder::operator<<(pSVar23,fVar54);
                tcu::SampleBuilder::operator<<(pSVar23,(EndSampleToken *)&tcu::TestLog::EndSample);
                if ((float  [2])auStack_5a0._0_8_ != (float  [2])0x0) {
                  operator_delete((void *)auStack_5a0._0_8_,auStack_5a0._16_8_ - auStack_5a0._0_8_);
                }
                _Var51._M_p = _Var51._M_p + 0x20;
                uVar34 = uVar34 - 1;
              } while (uVar34 != 0);
            }
            tcu::TestLog::endSampleList((TestLog *)afVar6);
            std::operator+(&local_748.m_name,"Program",&local_618.m_name);
            puVar24 = (undefined8 *)std::__cxx11::string::append((char *)&local_748);
            local_238 = (undefined1  [8])&local_228;
            paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar24 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar24 == paVar30) {
              local_228._M_allocated_capacity = paVar30->_M_allocated_capacity;
              local_228._8_8_ = puVar24[3];
            }
            else {
              local_228._M_allocated_capacity = paVar30->_M_allocated_capacity;
              local_238 = (undefined1  [8])*puVar24;
            }
            pp_Stack_230 = (_func_int **)puVar24[1];
            *puVar24 = paVar30;
            puVar24[1] = 0;
            *(undefined1 *)(puVar24 + 2) = 0;
            local_6c0.m_name._M_dataplus._M_p = (pointer)&local_6c0.m_name.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_6c0,"Workload cost estimate","");
            local_420.m_name._M_dataplus._M_p = (pointer)&local_420.m_name.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"us / workload","")
            ;
            pfVar36 = local_860 + (long)_local_808 * 5;
            tcu::LogNumber<float>::LogNumber
                      ((LogNumber<float> *)local_5a8,(string *)local_238,&local_6c0.m_name,
                       &local_420.m_name,QP_KEY_TAG_TIME,pfVar36[4]);
            tcu::TestLog::writeFloat
                      ((TestLog *)afVar6,(char *)local_5a8,local_588._M_dataplus._M_p,
                       local_568._M_dataplus._M_p,local_548,local_544);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_568._M_dataplus._M_p != &local_568.field_2) {
              operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_588._M_dataplus._M_p != &local_588.field_2) {
              operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_5a8 != (undefined1  [8])((long)auStack_5a0 + 8)) {
              operator_delete((void *)local_5a8,(ulong)(auStack_5a0._8_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420.m_name._M_dataplus._M_p != &local_420.m_name.field_2) {
              operator_delete(local_420.m_name._M_dataplus._M_p,
                              local_420.m_name.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6c0.m_name._M_dataplus._M_p != &local_6c0.m_name.field_2) {
              operator_delete(local_6c0.m_name._M_dataplus._M_p,
                              local_6c0.m_name.field_2._M_allocated_capacity + 1);
            }
            if (local_238 != (undefined1  [8])&local_228) {
              operator_delete((void *)local_238,(ulong)(local_228._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_748.m_name._M_dataplus._M_p != &local_748.m_name.field_2) {
              operator_delete(local_748.m_name._M_dataplus._M_p,
                              local_748.m_name.field_2._M_allocated_capacity + 1);
            }
            if (*pfVar36 == -INFINITY) {
              local_5a8 = (undefined1  [8])afVar6;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_5a0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)auStack_5a0,"Note: the data seem to form a single line: ",0x2b);
              lineParamsString_abi_cxx11_
                        ((string *)local_238,(Performance *)(pfVar36 + 3),params_01);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)auStack_5a0,(char *)local_238,(long)pp_Stack_230);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_5a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              if (local_238 != (undefined1  [8])&local_228) {
                operator_delete((void *)local_238,(ulong)(local_228._M_allocated_capacity + 1));
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_5a0);
              this_03 = local_530;
            }
            else {
              local_238 = (undefined1  [8])afVar6;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_230);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pp_Stack_230,
                         "Note: the data points with x coordinate greater than or equal to ",0x41);
              std::ostream::_M_insert<double>((double)*pfVar36);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pp_Stack_230,
                         " seem to form a rising line, and the rest of data points seem to form a near-horizontal line"
                         ,0x5c);
              local_5a8 = (undefined1  [8])
                          tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)local_238,
                                     (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_5a0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)auStack_5a0,"Note: the left line is estimated to be ",0x27);
              lineParamsString_abi_cxx11_(&local_748.m_name,(Performance *)(pfVar36 + 1),params);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)auStack_5a0,local_748.m_name._M_dataplus._M_p,
                         local_748.m_name._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)auStack_5a0," and the right line ",0x14);
              lineParamsString_abi_cxx11_(&local_6c0.m_name,(Performance *)(pfVar36 + 3),params_00);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)auStack_5a0,local_6c0.m_name._M_dataplus._M_p,
                         local_6c0.m_name._M_string_length);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_5a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6c0.m_name._M_dataplus._M_p != &local_6c0.m_name.field_2) {
                operator_delete(local_6c0.m_name._M_dataplus._M_p,
                                local_6c0.m_name.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_748.m_name._M_dataplus._M_p != &local_748.m_name.field_2) {
                operator_delete(local_748.m_name._M_dataplus._M_p,
                                local_748.m_name.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_5a0);
              std::ios_base::~ios_base(local_530);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_230);
              this_03 = local_1c0;
            }
            std::ios_base::~ios_base(this_03);
            tcu::TestLog::endSection((TestLog *)local_3b8._M_dataplus._M_p);
            std::
            vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
            ::~vector((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                       *)&local_658);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_618.m_name._M_dataplus._M_p != &local_618.m_name.field_2) {
              operator_delete(local_618.m_name._M_dataplus._M_p,
                              local_618.m_name.field_2._M_allocated_capacity + 1);
            }
            lVar45 = (long)_local_808 + 1;
            pSVar26 = (this->m_programs).
                      super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pSVar31 = (this->m_programs).
                      super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            uVar33 = (uint)((ulong)((long)pSVar31 - (long)pSVar26) >> 4);
            _local_808 = (double)lVar45;
          } while (lVar45 < (int)uVar33);
          lVar45 = local_5b0;
          if (0 < (int)uVar33) {
            pfVar36 = local_860 + 4;
            uVar34 = 0;
            do {
              if (*pfVar36 <= 0.0) {
                local_5a8 = (undefined1  [8])afVar6;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_5a0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)auStack_5a0,"Slope of measurements for program ",0x22);
                std::ostream::operator<<((ostringstream *)auStack_5a0,(int)uVar34);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)auStack_5a0," isn\'t positive. Can\'t get sensible result.",
                           0x2b);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_5a8,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_5a0);
                std::ios_base::~ios_base(local_530);
                pIVar27 = (InternalError *)__cxa_allocate_exception(0x38);
                tcu::InternalError::InternalError
                          (pIVar27,"Unable to get sensible measurements for estimation",(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                           ,0x3ea);
                __cxa_throw(pIVar27,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
              }
              uVar34 = uVar34 + 1;
              pfVar36 = pfVar36 + 5;
            } while ((uVar33 & 0x7fffffff) != uVar34);
          }
        }
      }
      local_638 = (float *)0x0;
      iStack_630._M_current = (float *)0x0;
      local_628 = (float *)0x0;
      if (0 < (int)((ulong)((long)pSVar31 - (long)pSVar26) >> 4)) {
        pfVar36 = local_860 + 4;
        lVar44 = 0;
        do {
          if (iStack_630._M_current == local_628) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&local_638,iStack_630,pfVar36);
            pSVar26 = (this->m_programs).
                      super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pSVar31 = (this->m_programs).
                      super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            *iStack_630._M_current = *pfVar36;
            iStack_630._M_current = iStack_630._M_current + 1;
          }
          lVar44 = lVar44 + 1;
          pfVar36 = pfVar36 + 5;
        } while (lVar44 < (int)((ulong)((long)pSVar31 - (long)pSVar26) >> 4));
      }
      (*(this->super_TestCase).super_TestNode._vptr_TestNode[9])();
      pfVar36 = local_638 + 1;
      pfVar19 = local_638;
      if (pfVar36 != iStack_630._M_current && local_638 != iStack_630._M_current) {
        fVar54 = *local_638;
        do {
          fVar53 = *pfVar36;
          pfVar20 = pfVar36;
          if (fVar53 <= fVar54) {
            fVar53 = fVar54;
            pfVar20 = pfVar19;
          }
          pfVar19 = pfVar20;
          pfVar36 = pfVar36 + 1;
          fVar54 = fVar53;
        } while (pfVar36 != iStack_630._M_current);
      }
      local_6d8.offset = *pfVar19;
      (*(this->super_TestCase).super_TestNode._vptr_TestNode[8])(this,&local_638);
      if (this->m_caseType == CASETYPE_VERTEX) {
        iVar55 = this->m_gridSizeX * this->m_gridSizeY * 6;
      }
      else {
        iVar55 = this->m_viewportHeight * this->m_viewportWidth;
      }
      fVar54 = floorf((local_860[1] - local_860[3]) / (value - local_860[2]));
      iVar62 = 0;
      if (0 < (int)fVar54) {
        iVar62 = (int)fVar54;
      }
      local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_828,"VertexOrFragmentCount","");
      bVar52 = this->m_caseType != CASETYPE_VERTEX;
      pcVar41 = "Fragment";
      if (!bVar52) {
        pcVar41 = "Vertex";
      }
      local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_788,pcVar41,pcVar41 + (ulong)bVar52 * 2 + 6);
      plVar22 = (long *)std::__cxx11::string::replace((ulong)&local_788,0,(char *)0x0,0x1c0e39b);
      local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
      psVar29 = (size_type *)(plVar22 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar22 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar29) {
        local_7f0.field_2._M_allocated_capacity = *psVar29;
        local_7f0.field_2._8_8_ = plVar22[3];
      }
      else {
        local_7f0.field_2._M_allocated_capacity = *psVar29;
        local_7f0._M_dataplus._M_p = (pointer)*plVar22;
      }
      local_7f0._M_string_length = plVar22[1];
      *plVar22 = (long)psVar29;
      plVar22[1] = 0;
      *(undefined1 *)(plVar22 + 2) = 0;
      plVar22 = (long *)std::__cxx11::string::append((char *)&local_7f0);
      local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
      psVar29 = (size_type *)(plVar22 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar22 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar29) {
        local_848.field_2._M_allocated_capacity = *psVar29;
        local_848.field_2._8_8_ = plVar22[3];
      }
      else {
        local_848.field_2._M_allocated_capacity = *psVar29;
        local_848._M_dataplus._M_p = (pointer)*plVar22;
      }
      local_848._M_string_length = plVar22[1];
      *plVar22 = (long)psVar29;
      plVar22[1] = 0;
      *(undefined1 *)(plVar22 + 2) = 0;
      local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,0x1af8059);
      tcu::LogNumber<long>::LogNumber
                ((LogNumber<long> *)local_5a8,&local_828,&local_848,&local_7b0,QP_KEY_TAG_NONE,
                 (long)iVar55);
      tcu::TestLog::writeInteger
                ((TestLog *)afVar6,(char *)local_5a8,local_588._M_dataplus._M_p,
                 local_568._M_dataplus._M_p,local_548,local_540);
      local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d0,"DrawCallsPerFrame","");
      local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_768,"D = Draw calls per frame","");
      local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,0x1af8059);
      tcu::LogNumber<long>::LogNumber
                ((LogNumber<long> *)local_238,&local_7d0,&local_768,&local_658,QP_KEY_TAG_NONE,
                 lVar45);
      tcu::TestLog::writeInteger
                ((TestLog *)afVar6,(char *)local_238,local_218._M_dataplus._M_p,
                 local_1f8._M_dataplus._M_p,local_1d8,local_1d0);
      local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3b8,"VerticesOrFragmentsPerFrame","");
      bVar52 = this->m_caseType == CASETYPE_VERTEX;
      pcVar41 = "Fragments";
      if (bVar52) {
        pcVar41 = "Vertices";
      }
      local_258[0] = local_248;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_258,pcVar41,pcVar41 + ((ulong)bVar52 ^ 9));
      plVar22 = (long *)std::__cxx11::string::replace((ulong)local_258,0,(char *)0x0,0x1be2570);
      local_338 = &local_328;
      plVar32 = plVar22 + 2;
      if ((long *)*plVar22 == plVar32) {
        local_328 = *plVar32;
        lStack_320 = plVar22[3];
      }
      else {
        local_328 = *plVar32;
        local_338 = (long *)*plVar22;
      }
      local_330 = plVar22[1];
      *plVar22 = (long)plVar32;
      plVar22[1] = 0;
      *(undefined1 *)(plVar22 + 2) = 0;
      plVar22 = (long *)std::__cxx11::string::append((char *)&local_338);
      local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
      psVar29 = (size_type *)(plVar22 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar22 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar29) {
        local_378.field_2._M_allocated_capacity = *psVar29;
        local_378.field_2._8_8_ = plVar22[3];
      }
      else {
        local_378.field_2._M_allocated_capacity = *psVar29;
        local_378._M_dataplus._M_p = (pointer)*plVar22;
      }
      local_378._M_string_length = plVar22[1];
      *plVar22 = (long)psVar29;
      plVar22[1] = 0;
      *(undefined1 *)(plVar22 + 2) = 0;
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,0x1af8059);
      iVar48 = iVar55 * (int)lVar45;
      tcu::LogNumber<long>::LogNumber
                (&local_748,&local_3b8,&local_378,&local_278,QP_KEY_TAG_NONE,(long)iVar48);
      tcu::TestLog::writeInteger
                ((TestLog *)afVar6,local_748.m_name._M_dataplus._M_p,
                 local_748.m_desc._M_dataplus._M_p,local_748.m_unit._M_dataplus._M_p,local_748.m_tag
                 ,local_748.m_value);
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"TimePerFramePerOp","");
      bVar52 = this->m_caseType == CASETYPE_VERTEX;
      pcVar41 = "fragments";
      if (bVar52) {
        pcVar41 = "vertices";
      }
      local_2b8[0] = local_2a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2b8,pcVar41,pcVar41 + ((ulong)bVar52 ^ 9));
      plVar22 = (long *)std::__cxx11::string::replace((ulong)local_2b8,0,(char *)0x0,0x1be2593);
      local_358 = &local_348;
      plVar32 = plVar22 + 2;
      if ((long *)*plVar22 == plVar32) {
        local_348 = *plVar32;
        lStack_340 = plVar22[3];
      }
      else {
        local_348 = *plVar32;
        local_358 = (long *)*plVar22;
      }
      local_350 = plVar22[1];
      *plVar22 = (long)plVar32;
      plVar22[1] = 0;
      *(undefined1 *)(plVar22 + 2) = 0;
      plVar22 = (long *)std::__cxx11::string::append((char *)&local_358);
      local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
      psVar29 = (size_type *)(plVar22 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar22 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar29) {
        local_398.field_2._M_allocated_capacity = *psVar29;
        local_398.field_2._8_8_ = plVar22[3];
      }
      else {
        local_398.field_2._M_allocated_capacity = *psVar29;
        local_398._M_dataplus._M_p = (pointer)*plVar22;
      }
      local_398._M_string_length = plVar22[1];
      *plVar22 = (long)psVar29;
      plVar22[1] = 0;
      *(undefined1 *)(plVar22 + 2) = 0;
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"us","");
      tcu::LogNumber<float>::LogNumber
                (&local_618,&local_298,&local_398,&local_2d8,QP_KEY_TAG_TIME,value);
      tcu::TestLog::writeFloat
                ((TestLog *)afVar6,local_618.m_name._M_dataplus._M_p,
                 local_618.m_desc._M_dataplus._M_p,local_618.m_unit._M_dataplus._M_p,local_618.m_tag
                 ,local_618.m_value);
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2f8,"TimePerDrawcallPerOp","");
      local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_318,"Estimated cost of one draw call with one shader operation",""
                );
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"us","");
      _local_808 = (double)value;
      local_790 = (float *)((double)value / (double)(int)lVar45);
      tcu::LogNumber<float>::LogNumber
                (&local_6c0,&local_2f8,&local_318,&local_50,QP_KEY_TAG_TIME,(float)(double)local_790
                );
      tcu::TestLog::writeFloat
                ((TestLog *)afVar6,local_6c0.m_name._M_dataplus._M_p,
                 local_6c0.m_desc._M_dataplus._M_p,local_6c0.m_unit._M_dataplus._M_p,local_6c0.m_tag
                 ,local_6c0.m_value);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"TimePerSingleOp","");
      local_6c8 = CONCAT44(local_6c8._4_4_,iVar62);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Estimated cost of a single shader operation","");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"us","");
      tcu::LogNumber<float>::LogNumber
                (&local_420,&local_70,&local_90,&local_b0,QP_KEY_TAG_TIME,
                 (float)((double)local_790 / (double)iVar55));
      tcu::TestLog::writeFloat
                ((TestLog *)afVar6,local_420.m_name._M_dataplus._M_p,
                 local_420.m_desc._M_dataplus._M_p,local_420.m_unit._M_dataplus._M_p,local_420.m_tag
                 ,local_420.m_value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420.m_unit._M_dataplus._M_p != &local_420.m_unit.field_2) {
        operator_delete(local_420.m_unit._M_dataplus._M_p,
                        local_420.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420.m_desc._M_dataplus._M_p != &local_420.m_desc.field_2) {
        operator_delete(local_420.m_desc._M_dataplus._M_p,
                        local_420.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420.m_name._M_dataplus._M_p != &local_420.m_name.field_2) {
        operator_delete(local_420.m_name._M_dataplus._M_p,
                        local_420.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c0.m_unit._M_dataplus._M_p != &local_6c0.m_unit.field_2) {
        operator_delete(local_6c0.m_unit._M_dataplus._M_p,
                        local_6c0.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c0.m_desc._M_dataplus._M_p != &local_6c0.m_desc.field_2) {
        operator_delete(local_6c0.m_desc._M_dataplus._M_p,
                        local_6c0.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c0.m_name._M_dataplus._M_p != &local_6c0.m_name.field_2) {
        operator_delete(local_6c0.m_name._M_dataplus._M_p,
                        local_6c0.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618.m_unit._M_dataplus._M_p != &local_618.m_unit.field_2) {
        operator_delete(local_618.m_unit._M_dataplus._M_p,
                        local_618.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618.m_desc._M_dataplus._M_p != &local_618.m_desc.field_2) {
        operator_delete(local_618.m_desc._M_dataplus._M_p,
                        local_618.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618.m_name._M_dataplus._M_p != &local_618.m_name.field_2) {
        operator_delete(local_618.m_name._M_dataplus._M_p,
                        local_618.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p != &local_398.field_2) {
        operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
      }
      if (local_358 != &local_348) {
        operator_delete(local_358,local_348 + 1);
      }
      if (local_2b8[0] != local_2a8) {
        operator_delete(local_2b8[0],local_2a8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_748.m_unit._M_dataplus._M_p != &local_748.m_unit.field_2) {
        operator_delete(local_748.m_unit._M_dataplus._M_p,
                        local_748.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_748.m_desc._M_dataplus._M_p != &local_748.m_desc.field_2) {
        operator_delete(local_748.m_desc._M_dataplus._M_p,
                        local_748.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_748.m_name._M_dataplus._M_p != &local_748.m_name.field_2) {
        operator_delete(local_748.m_name._M_dataplus._M_p,
                        local_748.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
      }
      if (local_338 != &local_328) {
        operator_delete(local_338,local_328 + 1);
      }
      if (local_258[0] != local_248) {
        operator_delete(local_258[0],local_248[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
        operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if (local_238 != (undefined1  [8])&local_228) {
        operator_delete((void *)local_238,(ulong)(local_228._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_658._M_dataplus._M_p != &local_658.field_2) {
        operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_768._M_dataplus._M_p != &local_768.field_2) {
        operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
        operator_delete(local_7d0._M_dataplus._M_p,local_7d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_568._M_dataplus._M_p != &local_568.field_2) {
        operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_588._M_dataplus._M_p != &local_588.field_2) {
        operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
      }
      afVar18 = (float  [2])((long)auStack_5a0 + 8);
      if ((float  [2])local_5a8 != afVar18) {
        operator_delete((void *)local_5a8,(ulong)(auStack_5a0._8_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
        operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_848._M_dataplus._M_p != &local_848.field_2) {
        operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
        operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_788._M_dataplus._M_p != &local_788.field_2) {
        operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_828._M_dataplus._M_p != &local_828.field_2) {
        operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
      }
      if (value <= local_6d8.offset * -0.1) {
        local_5a8 = (undefined1  [8])afVar6;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_5a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_5a0,"Got strongly negative result.",0x1d);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_5a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_5a0);
        std::ios_base::~ios_base(local_530);
        pIVar27 = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (pIVar27,"Unable to get sensible measurements for estimation",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                   ,0x428);
        __cxa_throw(pIVar27,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
      }
      if (_local_808 <= (double)local_6d8.offset * 0.001) {
        local_5a8 = (undefined1  [8])afVar6;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_5a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_5a0,"Cost of operation seems to be approximately zero.",0x31);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_5a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_5a0);
        std::ios_base::~ios_base(local_530);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        local_748.m_name._M_dataplus._M_p = (pointer)&local_748.m_name.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"OpsPerSecond","");
        local_618.m_name._M_dataplus._M_p = (pointer)&local_618.m_name.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_618,"Operations per second","");
        local_6c0.m_name._M_dataplus._M_p = (pointer)&local_6c0.m_name.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"Million/s","");
        fVar54 = (float)((double)iVar48 / _local_808);
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)local_238,&local_748.m_name,&local_618.m_name,
                   &local_6c0.m_name,QP_KEY_TAG_PERFORMANCE,fVar54);
        tcu::TestLog::writeFloat
                  ((TestLog *)afVar6,(char *)local_238,local_218._M_dataplus._M_p,
                   local_1f8._M_dataplus._M_p,local_1d8,local_1d4);
        local_420.m_name._M_dataplus._M_p = (pointer)&local_420.m_name.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"NumFreeOps","");
        local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_828,"Estimated number of \"free\" operations","");
        local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_848,0x1af8059);
        tcu::LogNumber<long>::LogNumber
                  ((LogNumber<long> *)local_5a8,&local_420.m_name,&local_828,&local_848,
                   QP_KEY_TAG_PERFORMANCE,local_6c8 & 0xffffffff);
        tcu::TestLog::writeInteger
                  ((TestLog *)afVar6,(char *)local_5a8,local_588._M_dataplus._M_p,
                   local_568._M_dataplus._M_p,local_548,local_540);
        iVar55 = extraout_EDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_568._M_dataplus._M_p != &local_568.field_2) {
          operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
          iVar55 = extraout_EDX_00;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._M_dataplus._M_p != &local_588.field_2) {
          operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
          iVar55 = extraout_EDX_01;
        }
        if ((float  [2])local_5a8 != afVar18) {
          operator_delete((void *)local_5a8,(ulong)(auStack_5a0._8_8_ + 1));
          iVar55 = extraout_EDX_02;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_848._M_dataplus._M_p != &local_848.field_2) {
          operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
          iVar55 = extraout_EDX_03;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_828._M_dataplus._M_p != &local_828.field_2) {
          operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
          iVar55 = extraout_EDX_04;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_420.m_name._M_dataplus._M_p != &local_420.m_name.field_2) {
          operator_delete(local_420.m_name._M_dataplus._M_p,
                          local_420.m_name.field_2._M_allocated_capacity + 1);
          iVar55 = extraout_EDX_05;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          iVar55 = extraout_EDX_06;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          iVar55 = extraout_EDX_07;
        }
        if (local_238 != (undefined1  [8])&local_228) {
          operator_delete((void *)local_238,(ulong)(local_228._M_allocated_capacity + 1));
          iVar55 = extraout_EDX_08;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6c0.m_name._M_dataplus._M_p != &local_6c0.m_name.field_2) {
          operator_delete(local_6c0.m_name._M_dataplus._M_p,
                          local_6c0.m_name.field_2._M_allocated_capacity + 1);
          iVar55 = extraout_EDX_09;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618.m_name._M_dataplus._M_p != &local_618.m_name.field_2) {
          operator_delete(local_618.m_name._M_dataplus._M_p,
                          local_618.m_name.field_2._M_allocated_capacity + 1);
          iVar55 = extraout_EDX_10;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_748.m_name._M_dataplus._M_p != &local_748.m_name.field_2) {
          operator_delete(local_748.m_name._M_dataplus._M_p,
                          local_748.m_name.field_2._M_allocated_capacity + 1);
          iVar55 = extraout_EDX_11;
        }
        this_01 = (this->super_TestCase).super_TestNode.m_testCtx;
        de::floatToString_abi_cxx11_((string *)local_5a8,(de *)0x2,fVar54,iVar55);
        tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_PASS,(char *)local_5a8);
        if ((float  [2])local_5a8 != afVar18) {
          operator_delete((void *)local_5a8,(ulong)(auStack_5a0._8_8_ + 1));
        }
      }
      this->m_state = STATE_FINISHED;
      if (local_638 != (float *)0x0) {
        operator_delete(local_638,(long)local_628 - (long)local_638);
      }
      operator_delete(local_860,(long)local_7f8 - (long)local_860);
      IVar37 = STOP;
    }
  }
  else {
    if (SVar14 == STATE_MEASURE) {
      iVar55 = (this->m_calibrator).m_measureState.numDrawCalls;
      dVar17 = deGetMicroseconds();
      render(this,iVar55);
      dVar16 = deGetMicroseconds();
      deqp::gls::TheilSenCalibrator::recordIteration(this_00,dVar16 - dVar17);
    }
    else if (SVar14 == STATE_RECOMPUTE_PARAMS) {
      deqp::gls::TheilSenCalibrator::recomputeParameters(this_00);
    }
    SVar14 = deqp::gls::TheilSenCalibrator::getState(this_00);
    IVar37 = CONTINUE;
    if (SVar14 == STATE_FINISHED) {
      deqp::gls::logCalibrationInfo
                (((this->super_TestCase).super_TestNode.m_testCtx)->m_log,this_00);
      afVar6 = (float  [2])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      if ((this->m_calibrator).m_measureState.numDrawCalls == 1) {
        dVar17 = deqp::gls::MeasureState::getTotalTime(&(this->m_calibrator).m_measureState);
        uVar25 = (long)(this->m_calibrator).m_measureState.frameTimes.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->m_calibrator).m_measureState.frameTimes.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        uVar34 = uVar25;
        if ((long)uVar25 < 0) {
          uVar34 = (ulong)((uint)uVar25 & 1) | uVar25 >> 1;
        }
        uVar15 = (undefined4)uVar34;
        fVar54 = (this->m_calibrator).m_params.targetFrameTimeUs / ((float)dVar17 / (float)uVar25);
        if (fVar54 < 0.95) {
          CVar5 = this->m_caseType;
          if (fVar54 < 0.0) {
            fVar54 = sqrtf(fVar54);
            uVar15 = extraout_EAX;
          }
          else {
            fVar54 = SQRT(fVar54);
          }
          if (CVar5 == CASETYPE_VERTEX) {
            uVar2 = this->m_gridSizeX;
            uVar4 = this->m_gridSizeY;
            iVar55 = (int)(fVar54 * (float)(int)uVar2);
            iVar62 = (int)(fVar54 * (float)(int)uVar4);
            this->m_gridSizeX = iVar55;
            this->m_gridSizeY = iVar62;
            auVar58._0_4_ = -(uint)(0 < iVar55);
            auVar58._4_4_ = -(uint)(0 < iVar55);
            auVar58._8_4_ = -(uint)(0 < iVar62);
            auVar58._12_4_ = -(uint)(0 < iVar62);
            iVar55 = movmskpd(uVar15,auVar58);
            if (iVar55 != 3) {
              this_02 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_02,"Can\'t decrease grid size enough to achieve low-enough draw times"
                         ,"m_gridSizeX >= 1 && m_gridSizeY >= 1",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                         ,0x371);
              goto LAB_0137146d;
            }
            local_5a8 = (undefined1  [8])afVar6;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_5a0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_5a0,
                       "Note: triangle grid size reduced from original; it\'s now smaller than during calibration."
                       ,0x59);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_5a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
          else {
            uVar1 = this->m_viewportWidth;
            uVar3 = this->m_viewportHeight;
            iVar55 = (int)(fVar54 * (float)(int)uVar1);
            iVar62 = (int)(fVar54 * (float)(int)uVar3);
            this->m_viewportWidth = iVar55;
            this->m_viewportHeight = iVar62;
            auVar61._0_4_ = -(uint)(0 < iVar55);
            auVar61._4_4_ = -(uint)(0 < iVar55);
            auVar61._8_4_ = -(uint)(0 < iVar62);
            auVar61._12_4_ = -(uint)(0 < iVar62);
            iVar55 = movmskpd(uVar15,auVar61);
            if (iVar55 != 3) {
              this_02 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_02,
                         "Can\'t decrease viewport size enough to achieve low-enough draw times",
                         "m_viewportWidth >= 1 && m_viewportHeight >= 1",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                         ,0x379);
LAB_0137146d:
              __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
            local_5a8 = (undefined1  [8])afVar6;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_5a0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_5a0,
                       "Note: viewport size reduced from original; it\'s now smaller than during calibration."
                       ,0x54);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_5a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_5a0);
          std::ios_base::~ios_base(local_530);
        }
      }
      prepareProgram(this,0);
      local_5a8 = (undefined1  [8])afVar6;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_5a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_5a0,"Grid size: ",0xb);
      std::ostream::operator<<((ostringstream *)auStack_5a0,this->m_gridSizeX);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_5a0,"x",1);
      std::ostream::operator<<((ostringstream *)auStack_5a0,this->m_gridSizeY);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_5a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_5a0);
      std::ios_base::~ios_base(local_530);
      local_5a8 = (undefined1  [8])afVar6;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_5a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_5a0,"Viewport: ",10);
      std::ostream::operator<<((ostringstream *)auStack_5a0,this->m_viewportWidth);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_5a0,"x",1);
      std::ostream::operator<<((ostringstream *)auStack_5a0,this->m_viewportHeight);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_5a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_5a0);
      std::ios_base::~ios_base(local_530);
      prepareNextRound(this);
      ((this->m_initialCalibrationStorage).m_ptr)->initialNumCalls =
           (this->m_calibrator).m_measureState.numDrawCalls;
    }
  }
  return IVar37;
}

Assistant:

OperatorPerformanceCase::IterateResult OperatorPerformanceCase::iterate (void)
{
	const TheilSenCalibrator::State calibratorState = m_calibrator.getState();

	if (calibratorState != TheilSenCalibrator::STATE_FINISHED)
	{
		if (calibratorState == TheilSenCalibrator::STATE_RECOMPUTE_PARAMS)
			m_calibrator.recomputeParameters();
		else if (calibratorState == TheilSenCalibrator::STATE_MEASURE)
			m_calibrator.recordIteration(renderAndMeasure(m_calibrator.getCallCount()));
		else
			DE_ASSERT(false);

		if (m_calibrator.getState() == TheilSenCalibrator::STATE_FINISHED)
		{
			logCalibrationInfo(m_testCtx.getLog(), m_calibrator);
			adjustAndLogGridAndViewport();
			prepareNextRound();
			m_initialCalibrationStorage->initialNumCalls = m_calibrator.getCallCount();
		}
	}
	else if (m_state == STATE_FIND_HIGH_WORKLOAD || m_state == STATE_MEASURING)
	{
		if (m_workloadMeasurementNdx < m_numMeasurementsPerWorkload)
		{
			vector<WorkloadRecord>& records = m_state == STATE_FIND_HIGH_WORKLOAD ? m_workloadRecordsFindHigh[m_measureProgramNdx] : m_workloadRecords[m_measureProgramNdx];
			records.back().addFrameTime((float)renderAndMeasure(m_calibrator.getCallCount()));
			m_workloadMeasurementNdx++;
		}
		else
			prepareNextRound();
	}
	else
	{
		DE_ASSERT(m_state == STATE_REPORTING);

		TestLog&	log				= m_testCtx.getLog();
		const int	drawCallCount	= m_calibrator.getCallCount();

		{
			// Compute per-program estimators for measurements.
			vector<SegmentedEstimator> estimators;
			for (int progNdx = 0; progNdx < (int)m_programs.size(); progNdx++)
				estimators.push_back(computeSegmentedEstimator(getWorkloadMedianDataPoints(progNdx)));

			// Log measurements and their estimators for all programs.
			for (int progNdx = 0; progNdx < (int)m_programs.size(); progNdx++)
			{
				const SegmentedEstimator&	estimator	= estimators[progNdx];
				const string				progNdxStr	= de::toString(progNdx);
				vector<WorkloadRecord>		records		= m_workloadRecords[progNdx];
				std::sort(records.begin(), records.end());

				{
					const tcu::ScopedLogSection section(log,
														"Program" + progNdxStr + "Measurements",
														"Measurements for program " + progNdxStr);

					// Sample list of individual frame times.

					log << TestLog::SampleList("Program" + progNdxStr + "IndividualFrameTimes", "Individual frame times")
						<< TestLog::SampleInfo << TestLog::ValueInfo("Workload",	"Workload",		"",		QP_SAMPLE_VALUE_TAG_PREDICTOR)
											   << TestLog::ValueInfo("FrameTime",	"Frame time",	"us",	QP_SAMPLE_VALUE_TAG_RESPONSE)
						<< TestLog::EndSampleInfo;

					for (int i = 0; i < (int)records.size(); i++)
						for (int j = 0; j < (int)records[i].frameTimes.size(); j++)
							log << TestLog::Sample << records[i].workloadSize << records[i].frameTimes[j] << TestLog::EndSample;

					log << TestLog::EndSampleList;

					// Sample list of median frame times.

					log << TestLog::SampleList("Program" + progNdxStr + "MedianFrameTimes", "Median frame times")
						<< TestLog::SampleInfo << TestLog::ValueInfo("Workload",		"Workload",				"",		QP_SAMPLE_VALUE_TAG_PREDICTOR)
											   << TestLog::ValueInfo("MedianFrameTime",	"Median frame time",	"us",	QP_SAMPLE_VALUE_TAG_RESPONSE)
						<< TestLog::EndSampleInfo;

					for (int i = 0; i < (int)records.size(); i++)
						log << TestLog::Sample << records[i].workloadSize << records[i].getMedianTime() << TestLog::EndSample;

					log << TestLog::EndSampleList;

					log << TestLog::Float("Program" + progNdxStr + "WorkloadCostEstimate", "Workload cost estimate", "us / workload", QP_KEY_TAG_TIME, estimator.right.coefficient);

					if (estimator.pivotX > -std::numeric_limits<float>::infinity())
						log << TestLog::Message << "Note: the data points with x coordinate greater than or equal to " << estimator.pivotX
												<< " seem to form a rising line, and the rest of data points seem to form a near-horizontal line" << TestLog::EndMessage
							<< TestLog::Message << "Note: the left line is estimated to be " << lineParamsString(estimator.left)
												<< " and the right line " << lineParamsString(estimator.right) << TestLog::EndMessage;
					else
						log << TestLog::Message << "Note: the data seem to form a single line: " << lineParamsString(estimator.right) << TestLog::EndMessage;
				}
			}

			for (int progNdx = 0; progNdx < (int)m_programs.size(); progNdx++)
			{
				if (estimators[progNdx].right.coefficient <= 0.0f)
				{
					log << TestLog::Message << "Slope of measurements for program " << progNdx << " isn't positive. Can't get sensible result." << TestLog::EndMessage;
					MEASUREMENT_FAIL();
				}
			}

			// \note For each estimator, .right.coefficient is the increase in draw time (in microseconds) when
			// incrementing shader workload size by 1, when D draw calls are done, with a vertex/fragment count
			// of R.
			//
			// The measurements of any single program can't tell us the final result (time of single operation),
			// so we use computeSingleOperationTime to compute it from multiple programs' measurements in a
			// subclass-defined manner.
			//
			// After that, microseconds per operation can be calculated as singleOperationTime / (D * R).

			{
				vector<float>	perProgramSlopes;
				for (int i = 0; i < (int)m_programs.size(); i++)
					perProgramSlopes.push_back(estimators[i].right.coefficient);

				logSingleOperationCalculationInfo();

				const float		maxSlope				= *std::max_element(perProgramSlopes.begin(), perProgramSlopes.end());
				const float		usecsPerFramePerOp		= computeSingleOperationTime(perProgramSlopes);
				const int		vertexOrFragmentCount	= m_caseType == CASETYPE_VERTEX ?
															getNumVertices(m_gridSizeX, m_gridSizeY) :
															m_viewportWidth*m_viewportHeight;
				const double	usecsPerDrawCallPerOp	= usecsPerFramePerOp / (double)drawCallCount;
				const double	usecsPerSingleOp		= usecsPerDrawCallPerOp / (double)vertexOrFragmentCount;
				const double	megaOpsPerSecond		= (double)(drawCallCount*vertexOrFragmentCount) / usecsPerFramePerOp;
				const int		numFreeOps				= de::max(0, (int)deFloatFloor(intersectionX(estimators[0].left,
																									 LineParameters(estimators[0].right.offset,
																													usecsPerFramePerOp))));

				log << TestLog::Integer("VertexOrFragmentCount",
										"R = " + string(m_caseType == CASETYPE_VERTEX ? "Vertex" : "Fragment") + " count",
										"", QP_KEY_TAG_NONE, vertexOrFragmentCount)

					<< TestLog::Integer("DrawCallsPerFrame", "D = Draw calls per frame", "", QP_KEY_TAG_NONE, drawCallCount)

					<< TestLog::Integer("VerticesOrFragmentsPerFrame",
										"R*D = " + string(m_caseType == CASETYPE_VERTEX ? "Vertices" : "Fragments") + " per frame",
										"", QP_KEY_TAG_NONE, vertexOrFragmentCount*drawCallCount)

					<< TestLog::Float("TimePerFramePerOp",
									  "Estimated cost of R*D " + string(m_caseType == CASETYPE_VERTEX ? "vertices" : "fragments")
									  + " (i.e. one frame) with one shader operation",
									  "us", QP_KEY_TAG_TIME, (float)usecsPerFramePerOp)

					<< TestLog::Float("TimePerDrawcallPerOp",
									  "Estimated cost of one draw call with one shader operation",
									  "us", QP_KEY_TAG_TIME, (float)usecsPerDrawCallPerOp)

					<< TestLog::Float("TimePerSingleOp",
									  "Estimated cost of a single shader operation",
									  "us", QP_KEY_TAG_TIME, (float)usecsPerSingleOp);

				// \note Sometimes, when the operation is free or very cheap, it can happen that the shader with the operation runs,
				//		 for some reason, a bit faster than the shader without the operation, and thus we get a negative result. The
				//		 following threshold values for accepting a negative or almost-zero result are rather quick and dirty.
				if (usecsPerFramePerOp <= -0.1f*maxSlope)
				{
					log << TestLog::Message << "Got strongly negative result." << TestLog::EndMessage;
					MEASUREMENT_FAIL();
				}
				else if (usecsPerFramePerOp <= 0.001*maxSlope)
				{
					log << TestLog::Message << "Cost of operation seems to be approximately zero." << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
				}
				else
				{
					log << TestLog::Float("OpsPerSecond",
										  "Operations per second",
										  "Million/s", QP_KEY_TAG_PERFORMANCE, (float)megaOpsPerSecond)

						<< TestLog::Integer("NumFreeOps",
											"Estimated number of \"free\" operations",
											"", QP_KEY_TAG_PERFORMANCE, numFreeOps);

					m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString((float)megaOpsPerSecond, 2).c_str());
				}

				m_state = STATE_FINISHED;
			}
		}

		return STOP;
	}

	return CONTINUE;
}